

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

bool __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
::IfConsiderConversion
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
           *this)

{
  ConstraintAcceptanceLevel CVar1;
  ExpressionAcceptanceLevel EVar2;
  int iVar3;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
  *in_RDI;
  BasicFlatModelAPI *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bool bVar4;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  undefined1 uVar5;
  
  CVar1 = BasicConstraintKeeper::GetChosenAcceptanceLevel
                    ((BasicConstraintKeeper *)
                     CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  uVar5 = true;
  bVar4 = (bool)uVar5;
  if (CVar1 != NotAccepted) {
    CVar1 = GetModelAPIAcceptance
                      ((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffd8);
    bVar4 = false;
    if (CVar1 == NotAccepted) {
      this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 *)GetConverter(in_RDI);
      bVar4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::IfWantNLOutput(this_00);
      if ((bVar4) &&
         (EVar2 = BasicConstraintKeeper::GetChosenAcceptanceLevelEXPR
                            ((BasicConstraintKeeper *)CONCAT17(uVar5,in_stack_fffffffffffffff0)),
         EVar2 != NotAccepted)) {
        return false;
      }
      iVar3 = AccLevelCommon((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                              *)0x265e0c);
      bVar4 = iVar3 != 2;
    }
  }
  return bVar4;
}

Assistant:

bool IfConsiderConversion() const {
    return
        (ConstraintAcceptanceLevel::NotAccepted == GetChosenAcceptanceLevel()
         || (ConstraintAcceptanceLevel::NotAccepted == GetModelAPIAcceptance()
             && (!GetConverter().IfWantNLOutput()
                 || ExpressionAcceptanceLevel::NotAccepted
                        == GetChosenAcceptanceLevelEXPR())
                && 2 != AccLevelCommon()));             // Not when acc:_all=2
  }